

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

xmlChar * xmlBufferDetach(xmlBufferPtr buf)

{
  xmlChar *pxVar1;
  
  if (buf == (xmlBufferPtr)0x0) {
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->content != buf->contentIO)) {
      pxVar1 = xmlStrndup(buf->content,buf->use);
      (*xmlFree)(buf->contentIO);
    }
    else {
      pxVar1 = buf->content;
    }
    buf->contentIO = (xmlChar *)0x0;
    buf->content = (xmlChar *)0x0;
    buf->use = 0;
    buf->size = 0;
  }
  return pxVar1;
}

Assistant:

xmlChar *
xmlBufferDetach(xmlBufferPtr buf) {
    xmlChar *ret;

    if (buf == NULL)
        return(NULL);

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
        (buf->content != buf->contentIO)) {
        ret = xmlStrndup(buf->content, buf->use);
        xmlFree(buf->contentIO);
    } else {
        ret = buf->content;
    }

    buf->contentIO = NULL;
    buf->content = NULL;
    buf->size = 0;
    buf->use = 0;

    return ret;
}